

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
emplace_back<slang::IntervalMapDetails::NodeRef_const&>
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,NodeRef *args)

{
  pointer __src;
  pointer pNVar1;
  ulong uVar2;
  pointer pNVar3;
  pointer pNVar4;
  pointer pNVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  pNVar1 = this->data_;
  __src = pNVar1 + this->len;
  if (this->len != this->cap) {
    (__src->pip).value = (args->pip).value;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return pNVar1 + sVar8;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar2 = this->cap;
  if (uVar9 < uVar2 * 2) {
    uVar9 = uVar2 * 2;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    uVar9 = 0xfffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  pNVar3 = (pointer)operator_new(uVar9 * 8);
  *(uintptr_t *)((long)pNVar3 + lVar7) = (args->pip).value;
  pNVar1 = this->data_;
  sVar8 = this->len;
  lVar6 = (long)pNVar1 + (sVar8 * 8 - (long)__src);
  pNVar4 = pNVar1;
  pNVar5 = pNVar3;
  if (lVar6 == 0) {
    pNVar4 = pNVar3;
    pNVar5 = pNVar1;
    if (sVar8 != 0) {
      do {
        (pNVar4->pip).value = (pNVar5->pip).value;
        pNVar5 = pNVar5 + 1;
        pNVar4 = pNVar4 + 1;
      } while (pNVar5 != __src);
    }
  }
  else {
    for (; pNVar4 != __src; pNVar4 = pNVar4 + 1) {
      (pNVar5->pip).value = (pNVar4->pip).value;
      pNVar5 = pNVar5 + 1;
    }
    memcpy((void *)((long)pNVar3 + lVar7 + 8),__src,(lVar6 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (pNVar1 != (pointer)this->firstElement) {
    operator_delete(pNVar1);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pNVar3;
  return (reference)((long)pNVar3 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }